

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::GL>
::test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  ulong *puVar2;
  TestError *this_00;
  string shader_source;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = (ulong)tested_shader_type;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"    float[2][2] x = float[2][2](float[4](1.0, 2.0, 3.0, 4.0));\n",
             "");
  std::operator+(&bStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_,&local_68);
  switch(uVar1) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b4619f_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&bStack_88);
    goto switchD_00b4619f_caseD_0;
  case 3:
    puVar2 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar2 = &set_tesseation_abi_cxx11_;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x814);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&bStack_88,*puVar2);
switchD_00b4619f_caseD_0:
  std::__cxx11::string::_M_append((char *)&bStack_88,shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,uVar1,&bStack_88);
  std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)local_68._M_string_length,0x1acdc5b);
  std::operator+(&local_48,&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_);
  std::__cxx11::string::operator=((string *)&bStack_88,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (*(code *)(&DAT_01aca45c + *(int *)(&DAT_01aca45c + uVar1 * 4)))();
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConstructors2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_variable_string = "    float[2][2] x = float[2][2](float[4](1.0, 2.0, 3.0, 4.0));\n";
	std::string shader_source		 = shader_start + base_variable_string;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);

	base_variable_string = "float[2][2] x = float[2][2](float[1][4](float[4](1.0, 2.0, 3.0, 4.0)));\n\n";
	shader_source		 = base_variable_string + shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);
}